

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptConversion.cpp
# Opt level: O0

int64 Js::JavascriptConversion::ToLength(Var aValue,ScriptContext *scriptContext)

{
  bool bVar1;
  BOOL BVar2;
  Var local_38;
  double local_30;
  double length;
  int64 length_1;
  ScriptContext *scriptContext_local;
  Var aValue_local;
  
  bVar1 = TaggedInt::Is(aValue);
  if (bVar1) {
    local_38 = (Var)TaggedInt::ToInt64(aValue);
    if ((long)local_38 < 0) {
      local_38 = (Var)0x0;
    }
    aValue_local = local_38;
  }
  else {
    local_30 = ToInteger(aValue,scriptContext);
    if ((local_30 < 0.0) || (BVar2 = JavascriptNumber::IsNegZero(local_30), BVar2 != 0)) {
      local_30 = 0.0;
    }
    else if (9007199254740991.0 < local_30) {
      local_30 = 9007199254740991.0;
    }
    aValue_local = (Var)NumberUtilities::TryToInt64(local_30);
  }
  return (int64)aValue_local;
}

Assistant:

int64 JavascriptConversion::ToLength(Var aValue, ScriptContext* scriptContext)
    {
        if (TaggedInt::Is(aValue))
        {
            int64 length = TaggedInt::ToInt64(aValue);
            return (length < 0) ? 0 : length;
        }

        double length = JavascriptConversion::ToInteger(aValue, scriptContext);

        if (length < 0.0 || JavascriptNumber::IsNegZero(length))
        {
            length = 0.0;
        }
        else if (length > Math::MAX_SAFE_INTEGER)
        {
            length = Math::MAX_SAFE_INTEGER;
        }

        return NumberUtilities::TryToInt64(length);
    }